

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.c
# Opt level: O0

void hd_while_pthread(hd_context *ctx)

{
  hd_context *ctx_local;
  
  while (((byte)ctx->pthread->field_0x4 >> 2 & 1) == 0) {
    hd_warn(ctx,"consumer_eof = false, sending signal...");
    wakeup_consumer(ctx->pthread);
    xusleep(1000);
  }
  return;
}

Assistant:

void
hd_while_pthread(hd_context *ctx)
{
    while(!ctx->pthread->consumer_eof)
    {
        hd_warn(ctx, "consumer_eof = false, sending signal...");
        wakeup_consumer(ctx->pthread);
        xusleep(1000);
    }
}